

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::declareTypeDefaults
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  if ((publicType->basicType == EbtAtomicUint) &&
     (uVar2 = *(ulong *)&(publicType->qualifier).field_0x1c, (short)(uVar2 >> 0x20) != -1)) {
    if (((uint)(uVar2 >> 0x20) & 0xffff) < (uint)(this->resources).maxAtomicCounterBindings) {
      iVar1 = (publicType->qualifier).layoutOffset;
      if (iVar1 == -1) {
        return;
      }
      this->atomicUintOffsets[uVar2 >> 0x20 & 0xffff] = iVar1;
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar5 = "atomic_uint binding is too large";
    pcVar4 = "binding";
  }
  else {
    if (publicType->arraySizes != (TArraySizes *)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"expect an array name","","");
    }
    bVar3 = TQualifier::hasNonXfbLayout(&publicType->qualifier);
    if (((!bVar3) &&
        (((uint)*(undefined8 *)&(publicType->qualifier).field_0x24 & 0x7fffffff) == 0x7fffffff)) ||
       ((publicType->qualifier).layoutBufferReference != false)) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
    pcVar5 = "useless application of layout qualifier";
    pcVar4 = "layout";
  }
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar5,pcVar4,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::declareTypeDefaults(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (publicType.basicType == EbtAtomicUint && publicType.qualifier.hasBinding()) {
        if (publicType.qualifier.layoutBinding >= (unsigned int)resources.maxAtomicCounterBindings) {
            error(loc, "atomic_uint binding is too large", "binding", "");
            return;
        }
        if (publicType.qualifier.hasOffset())
            atomicUintOffsets[publicType.qualifier.layoutBinding] = publicType.qualifier.layoutOffset;
        return;
    }

    if (publicType.arraySizes) {
        error(loc, "expect an array name", "", "");
    }

    if (publicType.qualifier.hasLayout() && !publicType.qualifier.hasBufferReference())
        warn(loc, "useless application of layout qualifier", "layout", "");
}